

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SdfAnnotateTask::~SdfAnnotateTask(SdfAnnotateTask *this)

{
  SdfAnnotateTask *this_local;
  
  ~SdfAnnotateTask(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

SdfAnnotateTask() : SystemTaskBase("$sdf_annotate") {}